

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderImageLoadStoreTests.cpp
# Opt level: O2

long __thiscall gl4cts::anon_unknown_0::AtomicMachine::RunStage(AtomicMachine *this,int stage)

{
  CallLogWrapper *pCVar1;
  ShaderImageLoadStoreBase *this_00;
  _Alloc_hider _Var2;
  char *pcVar3;
  bool bVar4;
  GLint GVar5;
  GLuint GVar6;
  GLuint program;
  long lVar7;
  char *pcVar8;
  GLenum in_ECX;
  GLenum GVar9;
  int in_EDX;
  int stage_00;
  int stage_01;
  GLenum e;
  GLenum e_00;
  Vector<float,_4> *v;
  Vector<float,_4> *v_00;
  int i;
  ulong uVar10;
  int iVar11;
  GLsizei GVar12;
  GLenum *pGVar13;
  GLuint local_e4;
  GLuint buffer;
  GLuint texture_result;
  string source;
  GLuint textures [7];
  char *src;
  ShaderImageLoadStoreBase *local_58;
  vec4 color;
  Vector<float,_4> VStack_40;
  
  this_00 = (ShaderImageLoadStoreBase *)(ulong)(uint)stage;
  bVar4 = ShaderImageLoadStoreBase::SupportedInStage
                    (&this->super_ShaderImageLoadStoreBase,stage,in_EDX);
  if (bVar4) {
    GVar9 = (&switchD_00a50e5c::switchdataD_016b937c)[(long)this_00] + 0x16b937c;
    local_58 = this_00;
    switch(this_00) {
    case (ShaderImageLoadStoreBase *)0x0:
      GenShader<int>(&source,(AtomicMachine *)0x0,stage_00,GVar9);
      local_e4 = ShaderImageLoadStoreBase::BuildProgram
                           (&this->super_ShaderImageLoadStoreBase,source._M_dataplus._M_p,
                            (char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0,(bool *)0x0);
      break;
    case (ShaderImageLoadStoreBase *)0x1:
      GenShader<int>(&source,(AtomicMachine *)&DAT_00000001,stage_00,GVar9);
      local_e4 = ShaderImageLoadStoreBase::BuildProgram
                           (&this->super_ShaderImageLoadStoreBase,
                            "#version 420 core\nvoid main() {}",source._M_dataplus._M_p,
                            "#version 420 core\nlayout(quads, point_mode) in;\nvoid main() {}",
                            (char *)0x0,(char *)0x0,(bool *)0x0);
      break;
    case (ShaderImageLoadStoreBase *)0x2:
      GenShader<int>(&source,(AtomicMachine *)0x2,stage_00,GVar9);
      local_e4 = ShaderImageLoadStoreBase::BuildProgram
                           (&this->super_ShaderImageLoadStoreBase,
                            "#version 420 core\nvoid main() {}",(char *)0x0,source._M_dataplus._M_p,
                            (char *)0x0,(char *)0x0,(bool *)0x0);
      break;
    case (ShaderImageLoadStoreBase *)0x3:
      GenShader<int>(&source,(AtomicMachine *)0x3,stage_00,GVar9);
      local_e4 = ShaderImageLoadStoreBase::BuildProgram
                           (&this->super_ShaderImageLoadStoreBase,
                            "#version 420 core\nvoid main() {}",(char *)0x0,(char *)0x0,
                            source._M_dataplus._M_p,(char *)0x0,(bool *)0x0);
      break;
    default:
      GenShader<int>(&source,(AtomicMachine *)&DAT_00000004,stage_00,in_ECX);
      src = source._M_dataplus._M_p;
      pCVar1 = &(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper;
      GVar6 = glu::CallLogWrapper::glCreateShader(pCVar1,0x91b9);
      glu::CallLogWrapper::glShaderSource(pCVar1,GVar6,1,&src,(GLint *)0x0);
      glu::CallLogWrapper::glCompileShader(pCVar1,GVar6);
      local_e4 = glu::CallLogWrapper::glCreateProgram(pCVar1);
      glu::CallLogWrapper::glAttachShader(pCVar1,local_e4,GVar6);
      glu::CallLogWrapper::glLinkProgram(pCVar1,local_e4);
      glu::CallLogWrapper::glDeleteShader(pCVar1,GVar6);
    }
    std::__cxx11::string::~string((string *)&source);
    pCVar1 = &(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper;
    glu::CallLogWrapper::glGenTextures(pCVar1,1,&texture_result);
    glu::CallLogWrapper::glBindTexture(pCVar1,0xde1,texture_result);
    glu::CallLogWrapper::glTexParameteri(pCVar1,0xde1,0x2801,0x2600);
    glu::CallLogWrapper::glTexParameteri(pCVar1,0xde1,0x2800,0x2600);
    glu::CallLogWrapper::glTexStorage2D(pCVar1,0xde1,1,0x8814,1,1);
    glu::CallLogWrapper::glGenTextures(pCVar1,7,textures);
    glu::CallLogWrapper::glGenBuffers(pCVar1,1,&buffer);
    pGVar13 = &DAT_016b98f0;
    for (uVar10 = 0; uVar10 != 7; uVar10 = uVar10 + 1) {
      GVar9 = *pGVar13;
      glu::CallLogWrapper::glBindTexture(pCVar1,GVar9,textures[uVar10]);
      if (uVar10 == 4) {
        glu::CallLogWrapper::glBindBuffer(pCVar1,0x8c2a,buffer);
        glu::CallLogWrapper::glBufferData(pCVar1,0x8c2a,4,(void *)0x0,0x88e8);
        glu::CallLogWrapper::glBindBuffer(pCVar1,0x8c2a,0);
        glu::CallLogWrapper::glTexBuffer(pCVar1,GVar9,0x8235,buffer);
        goto switchD_00a5109e_caseD_4;
      }
      glu::CallLogWrapper::glTexParameteri(pCVar1,GVar9,0x2801,0x2600);
      glu::CallLogWrapper::glTexParameteri(pCVar1,GVar9,0x2800,0x2600);
      switch(uVar10 & 0xffffffff) {
      case 0:
      case 2:
        goto LAB_00a510ec;
      case 1:
      case 6:
        glu::CallLogWrapper::glTexStorage3D(pCVar1,GVar9,1,0x8235,1,1,2);
        break;
      case 3:
        GVar9 = 0x8513;
LAB_00a510ec:
        GVar12 = 1;
LAB_00a510fa:
        glu::CallLogWrapper::glTexStorage2D(pCVar1,GVar9,1,0x8235,1,GVar12);
        break;
      case 5:
        GVar9 = 0x8c18;
        GVar12 = 2;
        goto LAB_00a510fa;
      }
switchD_00a5109e_caseD_4:
      pGVar13 = pGVar13 + 1;
    }
    glu::CallLogWrapper::glBindImageTexture(pCVar1,0,texture_result,0,'\0',0,0x88b9,0x8814);
    glu::CallLogWrapper::glBindImageTexture(pCVar1,1,textures[0],0,'\0',0,0x88ba,0x8235);
    glu::CallLogWrapper::glBindImageTexture(pCVar1,2,textures[1],0,'\x01',0,0x88ba,0x8235);
    glu::CallLogWrapper::glBindImageTexture(pCVar1,3,textures[2],0,'\0',0,0x88ba,0x8235);
    glu::CallLogWrapper::glBindImageTexture(pCVar1,4,textures[3],0,'\x01',0,0x88ba,0x8235);
    glu::CallLogWrapper::glBindImageTexture(pCVar1,5,textures[4],0,'\0',0,0x88ba,0x8235);
    glu::CallLogWrapper::glBindImageTexture(pCVar1,6,textures[5],0,'\x01',0,0x88ba,0x8235);
    glu::CallLogWrapper::glBindImageTexture(pCVar1,7,textures[6],0,'\x01',0,0x88ba,0x8235);
    glu::CallLogWrapper::glUseProgram(pCVar1,local_e4);
    GVar5 = glu::CallLogWrapper::glGetUniformLocation(pCVar1,local_e4,"g_image_result");
    glu::CallLogWrapper::glUniform1i(pCVar1,GVar5,0);
    GVar5 = glu::CallLogWrapper::glGetUniformLocation(pCVar1,local_e4,"g_image_2d");
    glu::CallLogWrapper::glUniform1i(pCVar1,GVar5,1);
    GVar5 = glu::CallLogWrapper::glGetUniformLocation(pCVar1,local_e4,"g_image_3d");
    glu::CallLogWrapper::glUniform1i(pCVar1,GVar5,2);
    GVar5 = glu::CallLogWrapper::glGetUniformLocation(pCVar1,local_e4,"g_image_2drect");
    glu::CallLogWrapper::glUniform1i(pCVar1,GVar5,3);
    GVar5 = glu::CallLogWrapper::glGetUniformLocation(pCVar1,local_e4,"g_image_cube");
    glu::CallLogWrapper::glUniform1i(pCVar1,GVar5,4);
    GVar5 = glu::CallLogWrapper::glGetUniformLocation(pCVar1,local_e4,"g_image_buffer");
    glu::CallLogWrapper::glUniform1i(pCVar1,GVar5,5);
    GVar5 = glu::CallLogWrapper::glGetUniformLocation(pCVar1,local_e4,"g_image_1darray");
    glu::CallLogWrapper::glUniform1i(pCVar1,GVar5,6);
    GVar5 = glu::CallLogWrapper::glGetUniformLocation(pCVar1,local_e4,"g_image_2darray");
    glu::CallLogWrapper::glUniform1i(pCVar1,GVar5,7);
    glu::CallLogWrapper::glBindVertexArray(pCVar1,this->m_vao);
    if (stage - 1U < 2) {
      glu::CallLogWrapper::glPatchParameteri(pCVar1,0x8e72,1);
      glu::CallLogWrapper::glDrawArrays(pCVar1,0xe,0,1);
      glu::CallLogWrapper::glPatchParameteri(pCVar1,0x8e72,3);
    }
    else if (stage == 4) {
      glu::CallLogWrapper::glDispatchCompute(pCVar1,1,1,1);
    }
    else {
      glu::CallLogWrapper::glDrawArrays(pCVar1,0,0,1);
    }
    tcu::Vector<float,_4>::Vector(&color);
    glu::CallLogWrapper::glBindTexture(pCVar1,0xde1,texture_result);
    glu::CallLogWrapper::glMemoryBarrier(pCVar1,0x100);
    GVar9 = 0x1908;
    glu::CallLogWrapper::glGetTexImage(pCVar1,0xde1,0,0x1908,0x1406,&color);
    source._M_dataplus._M_p = (pointer)0x3f80000000000000;
    source._M_string_length = 0x3f80000000000000;
    bVar4 = tcu::allEqual<float,4>(&color,(Vector<float,_4> *)&source);
    if (bVar4) {
      glu::CallLogWrapper::glUseProgram(pCVar1,0);
      glu::CallLogWrapper::glDeleteProgram(pCVar1,local_e4);
      glu::CallLogWrapper::glDeleteTextures(pCVar1,7,textures);
      glu::CallLogWrapper::glDeleteTextures(pCVar1,1,&texture_result);
      glu::CallLogWrapper::glDeleteBuffers(pCVar1,1,&buffer);
      if ((uint)stage < 4) {
        lVar7 = (*(code *)(&DAT_016b93a8 + *(int *)(&DAT_016b93a8 + (long)local_58 * 4)))();
        return lVar7;
      }
      GenShader<unsigned_int>(&source,(AtomicMachine *)&DAT_00000004,stage_01,GVar9);
      src = source._M_dataplus._M_p;
      GVar6 = glu::CallLogWrapper::glCreateShader(pCVar1,0x91b9);
      glu::CallLogWrapper::glShaderSource(pCVar1,GVar6,1,&src,(GLint *)0x0);
      glu::CallLogWrapper::glCompileShader(pCVar1,GVar6);
      program = glu::CallLogWrapper::glCreateProgram(pCVar1);
      glu::CallLogWrapper::glAttachShader(pCVar1,program,GVar6);
      glu::CallLogWrapper::glLinkProgram(pCVar1,program);
      glu::CallLogWrapper::glDeleteShader(pCVar1,GVar6);
      std::__cxx11::string::~string((string *)&source);
      glu::CallLogWrapper::glGenTextures(pCVar1,1,&texture_result);
      glu::CallLogWrapper::glBindTexture(pCVar1,0xde1,texture_result);
      glu::CallLogWrapper::glTexParameteri(pCVar1,0xde1,0x2801,0x2600);
      glu::CallLogWrapper::glTexParameteri(pCVar1,0xde1,0x2800,0x2600);
      glu::CallLogWrapper::glTexStorage2D(pCVar1,0xde1,1,0x8814,1,1);
      glu::CallLogWrapper::glGenTextures(pCVar1,7,textures);
      glu::CallLogWrapper::glGenBuffers(pCVar1,1,&buffer);
      pGVar13 = &DAT_016b98f0;
      for (uVar10 = 0; uVar10 != 7; uVar10 = uVar10 + 1) {
        GVar9 = *pGVar13;
        glu::CallLogWrapper::glBindTexture(pCVar1,GVar9,textures[uVar10]);
        if (uVar10 == 4) {
          glu::CallLogWrapper::glBindBuffer(pCVar1,0x8c2a,buffer);
          glu::CallLogWrapper::glBufferData(pCVar1,0x8c2a,4,(void *)0x0,0x88e8);
          glu::CallLogWrapper::glBindBuffer(pCVar1,0x8c2a,0);
          glu::CallLogWrapper::glTexBuffer(pCVar1,GVar9,0x8236,buffer);
          goto switchD_00a51856_caseD_4;
        }
        glu::CallLogWrapper::glTexParameteri(pCVar1,GVar9,0x2801,0x2600);
        glu::CallLogWrapper::glTexParameteri(pCVar1,GVar9,0x2800,0x2600);
        switch(uVar10 & 0xffffffff) {
        case 0:
        case 2:
          goto LAB_00a518a4;
        case 1:
        case 6:
          glu::CallLogWrapper::glTexStorage3D(pCVar1,GVar9,1,0x8236,1,1,2);
          break;
        case 3:
          GVar9 = 0x8513;
LAB_00a518a4:
          GVar12 = 1;
LAB_00a518b2:
          glu::CallLogWrapper::glTexStorage2D(pCVar1,GVar9,1,0x8236,1,GVar12);
          break;
        case 5:
          GVar9 = 0x8c18;
          GVar12 = 2;
          goto LAB_00a518b2;
        }
switchD_00a51856_caseD_4:
        pGVar13 = pGVar13 + 1;
      }
      glu::CallLogWrapper::glBindImageTexture(pCVar1,0,texture_result,0,'\0',0,0x88b9,0x8814);
      glu::CallLogWrapper::glBindImageTexture(pCVar1,1,textures[0],0,'\0',0,0x88ba,0x8236);
      glu::CallLogWrapper::glBindImageTexture(pCVar1,2,textures[1],0,'\x01',0,0x88ba,0x8236);
      glu::CallLogWrapper::glBindImageTexture(pCVar1,3,textures[2],0,'\0',0,0x88ba,0x8236);
      glu::CallLogWrapper::glBindImageTexture(pCVar1,4,textures[3],0,'\x01',0,0x88ba,0x8236);
      glu::CallLogWrapper::glBindImageTexture(pCVar1,5,textures[4],0,'\0',0,0x88ba,0x8236);
      glu::CallLogWrapper::glBindImageTexture(pCVar1,6,textures[5],0,'\x01',0,0x88ba,0x8236);
      glu::CallLogWrapper::glBindImageTexture(pCVar1,7,textures[6],0,'\x01',0,0x88ba,0x8236);
      glu::CallLogWrapper::glUseProgram(pCVar1,program);
      GVar5 = glu::CallLogWrapper::glGetUniformLocation(pCVar1,program,"g_image_result");
      glu::CallLogWrapper::glUniform1i(pCVar1,GVar5,0);
      GVar5 = glu::CallLogWrapper::glGetUniformLocation(pCVar1,program,"g_image_2d");
      glu::CallLogWrapper::glUniform1i(pCVar1,GVar5,1);
      GVar5 = glu::CallLogWrapper::glGetUniformLocation(pCVar1,program,"g_image_3d");
      glu::CallLogWrapper::glUniform1i(pCVar1,GVar5,2);
      GVar5 = glu::CallLogWrapper::glGetUniformLocation(pCVar1,program,"g_image_2drect");
      glu::CallLogWrapper::glUniform1i(pCVar1,GVar5,3);
      GVar5 = glu::CallLogWrapper::glGetUniformLocation(pCVar1,program,"g_image_cube");
      glu::CallLogWrapper::glUniform1i(pCVar1,GVar5,4);
      GVar5 = glu::CallLogWrapper::glGetUniformLocation(pCVar1,program,"g_image_buffer");
      glu::CallLogWrapper::glUniform1i(pCVar1,GVar5,5);
      GVar5 = glu::CallLogWrapper::glGetUniformLocation(pCVar1,program,"g_image_1darray");
      glu::CallLogWrapper::glUniform1i(pCVar1,GVar5,6);
      GVar5 = glu::CallLogWrapper::glGetUniformLocation(pCVar1,program,"g_image_2darray");
      glu::CallLogWrapper::glUniform1i(pCVar1,GVar5,7);
      glu::CallLogWrapper::glBindVertexArray(pCVar1,this->m_vao);
      if (stage - 1U < 2) {
        glu::CallLogWrapper::glPatchParameteri(pCVar1,0x8e72,1);
        glu::CallLogWrapper::glDrawArrays(pCVar1,0xe,0,1);
        glu::CallLogWrapper::glPatchParameteri(pCVar1,0x8e72,3);
      }
      else if (stage == 4) {
        glu::CallLogWrapper::glDispatchCompute(pCVar1,1,1,1);
      }
      else {
        glu::CallLogWrapper::glDrawArrays(pCVar1,0,0,1);
      }
      tcu::Vector<float,_4>::Vector(&color);
      glu::CallLogWrapper::glBindTexture(pCVar1,0xde1,texture_result);
      glu::CallLogWrapper::glMemoryBarrier(pCVar1,0x100);
      glu::CallLogWrapper::glGetTexImage(pCVar1,0xde1,0,0x1908,0x1406,&color);
      source._M_dataplus._M_p = (pointer)0x3f80000000000000;
      source._M_string_length = 0x3f80000000000000;
      bVar4 = tcu::allEqual<float,4>(&color,(Vector<float,_4> *)&source);
      if (!bVar4) {
        tcu::Vector<float,_4>::Vector(&VStack_40,&color);
        gl4cts::(anonymous_namespace)::ShaderImageLoadStoreBase::ToString<tcu::Vector<float,4>>
                  (&source,&VStack_40,v_00);
        _Var2 = source._M_dataplus;
        iVar11 = 0x8236;
        gl4cts::(anonymous_namespace)::ShaderImageLoadStoreBase::FormatEnumToString_abi_cxx11_
                  ((string *)&src,(void *)0x8236,e_00);
        pcVar3 = src;
        pcVar8 = ShaderImageLoadStoreBase::StageName(this_00,iVar11);
        anon_unknown_0::Output
                  ("Color is: %s. Format is: %s. Stage is: %s.\n",_Var2._M_p,pcVar3,pcVar8);
        std::__cxx11::string::~string((string *)&src);
        std::__cxx11::string::~string((string *)&source);
      }
      glu::CallLogWrapper::glUseProgram(pCVar1,0);
      glu::CallLogWrapper::glDeleteProgram(pCVar1,program);
      glu::CallLogWrapper::glDeleteTextures(pCVar1,7,textures);
      glu::CallLogWrapper::glDeleteTextures(pCVar1,1,&texture_result);
      glu::CallLogWrapper::glDeleteBuffers(pCVar1,1,&buffer);
      lVar7 = (ulong)bVar4 - 1;
    }
    else {
      tcu::Vector<float,_4>::Vector(&VStack_40,&color);
      gl4cts::(anonymous_namespace)::ShaderImageLoadStoreBase::ToString<tcu::Vector<float,4>>
                (&source,&VStack_40,v);
      _Var2 = source._M_dataplus;
      iVar11 = 0x8235;
      gl4cts::(anonymous_namespace)::ShaderImageLoadStoreBase::FormatEnumToString_abi_cxx11_
                ((string *)&src,(void *)0x8235,e);
      pcVar3 = src;
      pcVar8 = ShaderImageLoadStoreBase::StageName(this_00,iVar11);
      anon_unknown_0::Output
                ("Color is: %s. Format is: %s. Stage is: %s.\n",_Var2._M_p,pcVar3,pcVar8);
      std::__cxx11::string::~string((string *)&src);
      std::__cxx11::string::~string((string *)&source);
      glu::CallLogWrapper::glUseProgram(pCVar1,0);
      glu::CallLogWrapper::glDeleteProgram(pCVar1,local_e4);
      glu::CallLogWrapper::glDeleteTextures(pCVar1,7,textures);
      glu::CallLogWrapper::glDeleteTextures(pCVar1,1,&texture_result);
      glu::CallLogWrapper::glDeleteBuffers(pCVar1,1,&buffer);
      lVar7 = -1;
    }
  }
  else {
    lVar7 = 0x10;
  }
  return lVar7;
}

Assistant:

long RunStage(int stage)
	{
		if (!SupportedInStage(stage, 8))
			return NOT_SUPPORTED;
		if (!Atomic<GLint>(stage, GL_R32I))
			return ERROR;
		if (!Atomic<GLuint>(stage, GL_R32UI))
			return ERROR;
		return NO_ERROR;
	}